

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O1

sexp_conflict sexp_current_directory_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  char *pcVar1;
  char *__buf;
  sexp_conflict psVar2;
  uint uVar3;
  ulong __nmemb;
  bool bVar4;
  sexp_conflict res0;
  sexp_gc_var_t __sexp_gc_preserver1;
  char buf0 [256];
  sexp_conflict local_140;
  sexp_gc_var_t local_138;
  char local_128 [256];
  
  local_138.var = &local_140;
  local_140 = (sexp_conflict)0x43e;
  local_138.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_138;
  __buf = local_128;
  pcVar1 = getcwd(__buf,0x100);
  bVar4 = pcVar1 != (char *)0x0;
  if (!bVar4) {
    __nmemb = 0x100;
    __buf = local_128;
    do {
      uVar3 = (uint)__nmemb;
      if (0xa00000 < uVar3) {
        psVar2 = (sexp_conflict)
                 sexp_user_exception(ctx,self,"exceeded max auto-expand len in current-directory",
                                     0x23e);
        bVar4 = false;
        goto LAB_001040fe;
      }
      if (uVar3 != 0x100) {
        free(__buf);
      }
      __nmemb = (ulong)(uVar3 * 2);
      __buf = (char *)calloc(__nmemb,1);
      pcVar1 = getcwd(__buf,__nmemb);
    } while (pcVar1 == (char *)0x0);
  }
  psVar2 = (sexp_conflict)sexp_c_string(ctx,__buf,0xffffffffffffffff);
  local_140 = psVar2;
LAB_001040fe:
  if (!bVar4) {
    free(__buf);
  }
  (ctx->value).context.saves = local_138.next;
  return psVar2;
}

Assistant:

sexp sexp_current_directory_stub (sexp ctx, sexp self, sexp_sint_t n) {
  char *err;
  char buf0[256];
  int len0;
  char *tmp0;
  sexp res;
  sexp_gc_var1(res0);
  sexp_gc_preserve1(ctx, res0);
  len0 = 256;
  tmp0 = buf0;
 loop:
  err = getcwd(tmp0, len0);
  if (!err) {
  if (len0 > 10485760) {
    res = sexp_user_exception(ctx, self, "exceeded max auto-expand len in current-directory", SEXP_NULL);
} else {
  if (len0 != 256)
    free(tmp0);
  len0 *= 2;
  tmp0 = (char*) calloc(len0, sizeof(tmp0[0]));
  goto loop;
}
  } else {
  res0 = sexp_c_string(ctx, tmp0, -1);
  res = res0;
  }
  if (len0 != 256)
    free(tmp0);
  sexp_gc_release1(ctx);
  return res;
}